

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *address;
  int family;
  int sock;
  int family_00;
  int sock_00;
  int sock_01;
  int family_01;
  int sock_02;
  int family_02;
  int family_03;
  int sock_03;
  int sock_04;
  int sock_05;
  char *pcVar4;
  int iVar5;
  int opt;
  size_t sz;
  char any_address [128];
  int local_b4;
  long local_b0;
  char local_a8 [128];
  
  if (argc < 2) {
    sprintf(socket_address,"%s://%s:%d","ws","127.0.0.1",0x15b3);
    pcVar4 = "5555";
  }
  else {
    uVar1 = atoi(argv[1]);
    sprintf(socket_address,"%s://%s:%d","ws","127.0.0.1",(ulong)uVar1);
    pcVar4 = argv[1];
  }
  uVar1 = atoi(pcVar4);
  iVar2 = 0x1034cd;
  pcVar4 = "*";
  sprintf(local_a8,"%s://%s:%d","ws","*",(ulong)uVar1);
  iVar2 = test_socket_impl((char *)0x5b,iVar2,family,(int)pcVar4);
  test_bind_impl((char *)0x5c,iVar2,(int)local_a8,pcVar4);
  test_close_impl((char *)0x5d,iVar2,sock);
  iVar2 = test_socket_impl((char *)0x61,iVar2,family_00,(int)pcVar4);
  test_connect_impl((char *)0x62,iVar2,sock_00,pcVar4);
  iVar3 = (int)pcVar4;
  test_close_impl((char *)0x63,iVar2,sock_01);
  iVar2 = test_socket_impl((char *)0x66,iVar2,family_01,iVar3);
  local_b0 = 4;
  address = &local_b4;
  iVar3 = nn_getsockopt(iVar2,0xfffffffc,1);
  if (iVar3 == 0) {
    if (local_b0 != 4) goto LAB_001025a1;
    if (local_b4 != 2) goto LAB_001025a6;
    iVar3 = nn_connect(iVar2,"ws://127.0.0.1");
    if (iVar3 < 0) goto LAB_001025ab;
    iVar3 = nn_connect(iVar2,"ws://*:");
    if (-1 < iVar3) goto LAB_001025b0;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_001025b5;
    iVar3 = nn_connect(iVar2,"ws://*:1000000");
    if (-1 < iVar3) goto LAB_001025ba;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_001025bf;
    iVar3 = nn_connect(iVar2,"ws://*:some_port");
    if (-1 < iVar3) goto LAB_001025c4;
    iVar3 = nn_connect(iVar2,"ws://eth10000;127.0.0.1:5555");
    if (-1 < iVar3) goto LAB_001025c9;
    iVar3 = nn_errno();
    if (iVar3 != 0x13) goto LAB_001025ce;
    iVar3 = nn_bind(iVar2,"ws://127.0.0.1:");
    if (-1 < iVar3) goto LAB_001025d3;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_001025d8;
    iVar3 = nn_bind(iVar2,"ws://127.0.0.1:1000000");
    if (-1 < iVar3) goto LAB_001025dd;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_001025e2;
    iVar3 = nn_bind(iVar2,"ws://eth10000:5555");
    if (-1 < iVar3) goto LAB_001025e7;
    iVar3 = nn_errno();
    if (iVar3 != 0x13) goto LAB_001025ec;
    iVar3 = nn_connect(iVar2,"ws://:5555");
    if (-1 < iVar3) goto LAB_001025f1;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_001025f6;
    iVar3 = nn_connect(iVar2,"ws://-hostname:5555");
    if (-1 < iVar3) goto LAB_001025fb;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102600;
    iVar3 = nn_connect(iVar2,"ws://abc.123.---.#:5555");
    if (-1 < iVar3) goto LAB_00102605;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_0010260a;
    iVar3 = nn_connect(iVar2,"ws://[::1]:5555");
    if (-1 < iVar3) goto LAB_0010260f;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102614;
    iVar3 = nn_connect(iVar2,"ws://abc.123.:5555");
    if (-1 < iVar3) goto LAB_00102619;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_0010261e;
    iVar3 = nn_connect(iVar2,"ws://abc...123:5555");
    if (-1 < iVar3) goto LAB_00102623;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102628;
    iVar3 = nn_connect(iVar2,"ws://.123:5555");
    if (iVar3 < 0) {
      iVar3 = nn_errno();
      if (iVar3 == 0x16) {
        test_close_impl((char *)0xa9,iVar2,sock_02);
        nn_sleep(200);
        iVar3 = test_socket_impl((char *)0xad,iVar2,family_02,(int)address);
        iVar2 = iVar3;
        test_bind_impl((char *)0xae,iVar3,0x1060e0,(char *)address);
        iVar2 = test_socket_impl((char *)0xaf,iVar2,family_03,(int)address);
        test_connect_impl((char *)0xb0,iVar2,sock_03,(char *)address);
        nn_sleep(200);
        iVar5 = 100;
        do {
          test_send_impl((char *)0xb8,iVar2,0x103274,(char *)address);
          test_recv_impl((char *)0xb9,iVar3,0x103274,(char *)address);
          test_send_impl((char *)0xbb,iVar3,0x103278,(char *)address);
          test_recv_impl((char *)0xbc,iVar2,0x103278,(char *)address);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        iVar5 = 100;
        do {
          test_send_impl((char *)0xc1,iVar2,0x10327c,(char *)address);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        iVar5 = 100;
        do {
          test_recv_impl((char *)0xc4,iVar3,0x10327c,(char *)address);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        test_close_impl((char *)0xc7,iVar2,sock_04);
        test_close_impl((char *)0xc8,iVar3,sock_05);
        test_text();
        return 0;
      }
      goto LAB_00102632;
    }
  }
  else {
    main_cold_1();
LAB_001025a1:
    main_cold_2();
LAB_001025a6:
    main_cold_3();
LAB_001025ab:
    main_cold_31();
LAB_001025b0:
    main_cold_30();
LAB_001025b5:
    main_cold_4();
LAB_001025ba:
    main_cold_29();
LAB_001025bf:
    main_cold_5();
LAB_001025c4:
    main_cold_28();
LAB_001025c9:
    main_cold_27();
LAB_001025ce:
    main_cold_6();
LAB_001025d3:
    main_cold_26();
LAB_001025d8:
    main_cold_7();
LAB_001025dd:
    main_cold_25();
LAB_001025e2:
    main_cold_8();
LAB_001025e7:
    main_cold_24();
LAB_001025ec:
    main_cold_9();
LAB_001025f1:
    main_cold_23();
LAB_001025f6:
    main_cold_10();
LAB_001025fb:
    main_cold_22();
LAB_00102600:
    main_cold_11();
LAB_00102605:
    main_cold_21();
LAB_0010260a:
    main_cold_12();
LAB_0010260f:
    main_cold_20();
LAB_00102614:
    main_cold_13();
LAB_00102619:
    main_cold_19();
LAB_0010261e:
    main_cold_14();
LAB_00102623:
    main_cold_18();
LAB_00102628:
    main_cold_15();
  }
  main_cold_17();
LAB_00102632:
  main_cold_16();
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int sb;
    int sc;
    int opt;
    size_t sz;
    int i;
    char any_address[128];

    test_addr_from(socket_address, "ws", "127.0.0.1",
            get_test_port(argc, argv));

    test_addr_from(any_address, "ws", "*",
            get_test_port(argc, argv));

    /*  Try closing bound but unconnected socket. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, any_address);
    test_close (sb);

    /*  Try closing a TCP socket while it not connected. At the same time
        test specifying the local address for the connection. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    test_close (sc);

    /*  Open the socket anew. */
    sc = test_socket (AF_SP, NN_PAIR);

    /*  Check socket options. */
    sz = sizeof (opt);
    rc = nn_getsockopt (sc, NN_WS, NN_WS_MSG_TYPE, &opt, &sz);
    errno_assert (rc == 0);
    nn_assert (sz == sizeof (opt));
    nn_assert (opt == NN_WS_MSG_TYPE_BINARY);

#if 0
    //opt = 100;
    //sz = sizeof (opt);
    //rc = nn_getsockopt (sc, NN_WS, NN_WS_HANDSHAKE_TIMEOUT, &opt, &sz);
    //errno_assert (rc == 0);
    //nn_assert (sz == sizeof (opt));
    //nn_assert (opt == 100);
#endif

    /*  Default port 80 should be assumed if not explicitly declared. */
    rc = nn_connect (sc, "ws://127.0.0.1");
    errno_assert (rc >= 0);

    /*  Try using invalid address strings. */
    rc = nn_connect (sc, "ws://*:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:some_port");
    nn_assert (rc < 0);
    rc = nn_connect (sc, "ws://eth10000;127.0.0.1:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_bind (sc, "ws://127.0.0.1:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://127.0.0.1:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://eth10000:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_connect (sc, "ws://:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://-hostname:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc.123.---.#:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://[::1]:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc.123.:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc...123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://.123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);

    test_close (sc);

    nn_sleep (200);

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);

    /*  Leave enough time for connection establishment. */
    nn_sleep (200);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_recv (sb, "ABC");

        test_send (sb, "DEF");
        test_recv (sc, "DEF");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "0123456789012345678901234567890123456789");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "0123456789012345678901234567890123456789");
    }

    test_close (sc);
    test_close (sb);

    test_text ();

    return 0;
}